

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

void eastl::swap<eastl::pair<char,int>*>(pair<char,_int> **a,pair<char,_int> **b)

{
  pair<char,_int> *ppVar1;
  pair<char,_int> *temp;
  pair<char,_int> **b_local;
  pair<char,_int> **a_local;
  
  ppVar1 = *a;
  *a = *b;
  *b = ppVar1;
  return;
}

Assistant:

inline void swap(T& a, T& b)
    {
#ifdef EA_COMPILER_HAS_MOVE_SEMANTICS
        T temp = std::move(a);
        a = std::move(b);
        b = std::move(temp);
#else
        T temp(a);
        a = b;
        b = temp;
#endif
    }